

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O0

void __thiscall
Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
          (Matrix_Dense<double,_0UL,_0UL> *this,
          initializer_list<Disa::Vector_Dense<double,_0UL>_> *list)

{
  Vector_Dense<double,_0UL> *pVVar1;
  size_type __new_size;
  source_location *psVar2;
  vector<double,_std::allocator<double>_> *this_00;
  source_location *location;
  ostream *poVar3;
  reference this_01;
  __normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
  local_80;
  undefined **local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Vector_Dense<double,_0UL> *local_50;
  Vector_Dense<double,_0UL> *item;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> *__range2;
  iterator iter;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> *list_local;
  Matrix_Dense<double,_0UL,_0UL> *this_local;
  
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  vector(&this->
          super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
        );
  __new_size = std::initializer_list<Disa::Vector_Dense<double,_0UL>_>::size(list);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  resize(&this->
          super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         ,__new_size);
  __range2 = (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)
             std::
             vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ::begin(&this->
                      super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    );
  __begin0 = (const_iterator)list;
  __end0 = std::initializer_list<Disa::Vector_Dense<double,_0UL>_>::begin(list);
  item = std::initializer_list<Disa::Vector_Dense<double,_0UL>_>::end
                   ((initializer_list<Disa::Vector_Dense<double,_0UL>_> *)__begin0);
  while( true ) {
    if (__end0 == item) {
      return;
    }
    local_50 = __end0;
    psVar2 = (source_location *)
             std::vector<double,_std::allocator<double>_>::size
                       (&__end0->super_vector<double,_std::allocator<double>_>);
    this_00 = &std::initializer_list<Disa::Vector_Dense<double,_0UL>_>::begin(list)->
               super_vector<double,_std::allocator<double>_>;
    location = (source_location *)std::vector<double,_std::allocator<double>_>::size(this_00);
    pVVar1 = local_50;
    if (psVar2 != location) break;
    local_80 = __gnu_cxx::
               __normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
               ::operator++((__normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
                             *)&__range2,0);
    this_01 = __gnu_cxx::
              __normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
              ::operator*(&local_80);
    Vector_Dense<double,_0UL>::operator=(this_01,pVVar1);
    __end0 = __end0 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
  local_78 = &PTR_s__workspace_llm4binary_github_lic_001ee338;
  console_format_abi_cxx11_(&local_70,(Disa *)0x0,(Log_Level)&local_78,location);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"List dimension varies.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_70);
  exit(1);
}

Assistant:

Matrix_Dense(const std::initializer_list<Vector_Dense<_type, 0>>& list) {
    resize(list.size());
    auto iter = this->begin();
    FOR_EACH(item, list) {
      ASSERT_DEBUG(item.size() == list.begin()->size(), "List dimension varies.");
      *iter++ = item;
    }
  }